

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

bool __thiscall TextBuffer::Layer::has_astral(Layer *this)

{
  bool result;
  bool local_29;
  anon_class_8_1_6971b95b local_28;
  Point local_20;
  
  local_29 = false;
  Point::Point(&local_20);
  local_28.result = &local_29;
  for_each_chunk_in_range<TextBuffer::Layer::has_astral()::_lambda(TextSlice)_1_>
            (this,local_20,this->extent_,&local_28,false);
  return local_29;
}

Assistant:

bool has_astral() {
    bool result = false;
    for_each_chunk_in_range(Point(), extent(), [&](TextSlice chunk) {
      for (auto ch : chunk) {
        if ((ch & 0xf800) == 0xd800) {
          result = true;
          return true;
        }
      }
      return false;
    });
    return result;
  }